

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::DynamicStruct::Builder::which
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,Builder *this)

{
  uint16_t uVar1;
  unsigned_short discriminant;
  uint32_t offset;
  StructDataOffset offset_00;
  undefined1 local_78 [6];
  uint16_t discrim;
  undefined1 local_48 [8];
  Reader structProto;
  Builder *this_local;
  
  structProto._reader._40_8_ = this;
  Schema::getProto((Reader *)local_78,(Schema *)this);
  capnp::schema::Node::Reader::getStruct((Reader *)local_48,(Reader *)local_78);
  uVar1 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_48);
  if (uVar1 == 0) {
    kj::Maybe<capnp::StructSchema::Field>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    offset = capnp::schema::Node::Struct::Reader::getDiscriminantOffset((Reader *)local_48);
    offset_00 = assumeDataOffset(offset);
    discriminant = _::StructBuilder::getDataField<unsigned_short>(&this->builder,offset_00);
    StructSchema::getFieldByDiscriminant(__return_storage_ptr__,&this->schema,discriminant);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> DynamicStruct::Builder::which() {
  auto structProto = schema.getProto().getStruct();
  if (structProto.getDiscriminantCount() == 0) {
    return nullptr;
  }

  uint16_t discrim = builder.getDataField<uint16_t>(
      assumeDataOffset(structProto.getDiscriminantOffset()));
  return schema.getFieldByDiscriminant(discrim);
}